

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# panic.c
# Opt level: O0

void nni_panic(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1a8 [8];
  undefined8 local_1a0;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined8 local_148;
  undefined8 local_138;
  undefined8 local_128;
  undefined8 local_118;
  undefined8 local_108;
  undefined4 local_f8;
  undefined4 local_f4;
  va_list va;
  char local_d8 [8];
  char fbuf [93];
  char buf [100];
  char *fmt_local;
  
  if (in_AL != '\0') {
    local_178 = in_XMM0_Qa;
    local_168 = in_XMM1_Qa;
    local_158 = in_XMM2_Qa;
    local_148 = in_XMM3_Qa;
    local_138 = in_XMM4_Qa;
    local_128 = in_XMM5_Qa;
    local_118 = in_XMM6_Qa;
    local_108 = in_XMM7_Qa;
  }
  va[0].overflow_arg_area = local_1a8;
  va[0]._0_8_ = &stack0x00000008;
  local_f4 = 0x30;
  local_f8 = 8;
  local_1a0 = in_RSI;
  local_198 = in_RDX;
  local_190 = in_RCX;
  local_188 = in_R8;
  local_180 = in_R9;
  vsnprintf(local_d8,0x5d,fmt,&local_f8);
  snprintf(fbuf + 0x58,100,"panic: %s",local_d8);
  nni_println(fbuf + 0x58);
  nni_println("This message is indicative of a BUG.");
  nni_println("Report this at https://github.com/nanomsg/nng/issues");
  nni_show_backtrace();
  nni_plat_abort();
  return;
}

Assistant:

void
nni_panic(const char *fmt, ...)
{
	char    buf[100];
	char    fbuf[93]; // 7 bytes of "panic: "
	va_list va;

	va_start(va, fmt);
	(void) vsnprintf(fbuf, sizeof(fbuf), fmt, va);
	va_end(va);

	(void) snprintf(buf, sizeof(buf), "panic: %s", fbuf);

	nni_println(buf);
	nni_println("This message is indicative of a BUG.");
	nni_println("Report this at https://github.com/nanomsg/nng/issues");

	nni_show_backtrace();
	nni_plat_abort();
}